

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

bool vkb::detail::check_layer_supported
               (vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *available_layers,
               char *layer_name)

{
  pointer pVVar1;
  int iVar2;
  bool bVar3;
  pointer __s2;
  bool bVar4;
  
  if (layer_name == (char *)0x0) {
    bVar3 = false;
  }
  else {
    __s2 = (available_layers->
           super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>)._M_impl.
           super__Vector_impl_data._M_start;
    pVVar1 = (available_layers->
             super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      bVar4 = __s2 == pVVar1;
      bVar3 = !bVar4;
      if (bVar4) {
        return bVar3;
      }
      iVar2 = strcmp(layer_name,__s2->layerName);
      __s2 = __s2 + 1;
    } while (iVar2 != 0);
  }
  return bVar3;
}

Assistant:

bool check_layer_supported(std::vector<VkLayerProperties> const& available_layers, const char* layer_name) {
    if (!layer_name) return false;
    for (const auto& layer_properties : available_layers) {
        if (strcmp(layer_name, layer_properties.layerName) == 0) {
            return true;
        }
    }
    return false;
}